

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

bool QFontDatabase::removeApplicationEmojiFontFamily(QString *familyName)

{
  bool bVar1;
  Type *pTVar2;
  QDeadlineTimer QVar3;
  
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)familyName);
  if (pTVar2 != (Type *)0x0) {
    QVar3.t2 = 0xffffffff;
    QVar3.type = 0x7fffffff;
    QVar3.t1 = (qint64)pTVar2;
    QRecursiveMutex::tryLock(QVar3);
  }
  QFontDatabasePrivate::instance();
  bVar1 = QFontDatabasePrivate::removeApplicationFallbackFontFamily
                    (&QFontDatabasePrivate::instance::instance,Script_Emoji,familyName);
  if (pTVar2 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  return bVar1;
}

Assistant:

bool QFontDatabase::removeApplicationEmojiFontFamily(const QString &familyName)
{
    QMutexLocker locker(fontDatabaseMutex());
    auto *db = QFontDatabasePrivate::instance();
    return db->removeApplicationFallbackFontFamily(QFontDatabasePrivate::Script_Emoji,
                                                   familyName);
}